

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffppr(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *array,int *status)

{
  ULONGLONG *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  long unaff_retaddr;
  long group;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*in_R9 < 1) {
    if (in_ESI == 0xb) {
      ffpprb((fitsfile *)group,unaff_retaddr,
             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (uchar *)CONCAT44(0xb,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0xc) {
      ffpprsb((fitsfile *)group,unaff_retaddr,
              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
              (char *)CONCAT44(0xc,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x14) {
      ffpprui((fitsfile *)group,unaff_retaddr,
              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
              (unsigned_short *)CONCAT44(0x14,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x15) {
      ffppri((fitsfile *)group,unaff_retaddr,
             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (short *)CONCAT44(0x15,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x1e) {
      ffppruk((fitsfile *)group,unaff_retaddr,
              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
              (uint *)CONCAT44(0x1e,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x1f) {
      ffpprk((fitsfile *)group,unaff_retaddr,
             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (int *)CONCAT44(0x1f,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x28) {
      ffppruj((fitsfile *)group,unaff_retaddr,
              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
              (unsigned_long *)CONCAT44(0x28,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x29) {
      ffpprj((fitsfile *)group,unaff_retaddr,
             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (long *)CONCAT44(0x29,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x50) {
      ffpprujj((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               CONCAT44(0x50,in_stack_ffffffffffffffe8),(LONGLONG)in_RDX,in_RCX,in_R8);
    }
    else if (in_ESI == 0x51) {
      ffpprjj((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
              CONCAT44(0x51,in_stack_ffffffffffffffe8),(LONGLONG)in_RDX,(LONGLONG *)in_RCX,in_R8);
    }
    else if (in_ESI == 0x2a) {
      ffppre((fitsfile *)group,unaff_retaddr,
             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (float *)CONCAT44(0x2a,in_stack_ffffffffffffffe8),in_RDX);
    }
    else if (in_ESI == 0x52) {
      ffpprd((fitsfile *)group,unaff_retaddr,
             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (double *)CONCAT44(0x52,in_stack_ffffffffffffffe8),in_RDX);
    }
    else {
      *in_R9 = 0x19a;
    }
    iVar1 = *in_R9;
  }
  else {
    iVar1 = *in_R9;
  }
  return iVar1;
}

Assistant:

int ffppr(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

*/
{
    long group = 1;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBYTE)
    {
      ffpprb(fptr, group, firstelem, nelem, (unsigned char *) array, status);
    }
    else if (datatype == TSBYTE)
    {
      ffpprsb(fptr, group, firstelem, nelem, (signed char *) array, status);
    }
    else if (datatype == TUSHORT)
    {
      ffpprui(fptr, group, firstelem, nelem, (unsigned short *) array,
              status);
    }
    else if (datatype == TSHORT)
    {
      ffppri(fptr, group, firstelem, nelem, (short *) array, status);
    }
    else if (datatype == TUINT)
    {
      ffppruk(fptr, group, firstelem, nelem, (unsigned int *) array, status);
    }
    else if (datatype == TINT)
    {
      ffpprk(fptr, group, firstelem, nelem, (int *) array, status);
    }
    else if (datatype == TULONG)
    {
      ffppruj(fptr, group, firstelem, nelem, (unsigned long *) array, status);
    }
    else if (datatype == TLONG)
    {
      ffpprj(fptr, group, firstelem, nelem, (long *) array, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpprujj(fptr, group, firstelem, nelem, (ULONGLONG *) array, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpprjj(fptr, group, firstelem, nelem, (LONGLONG *) array, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppre(fptr, group, firstelem, nelem, (float *) array, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpprd(fptr, group, firstelem, nelem, (double *) array, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}